

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_decompressSequencesLong
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset,int frame)

{
  int iVar1;
  ZSTD_DCtx_s *in_RDI;
  int in_stack_0000008c;
  size_t in_stack_00000090;
  void *in_stack_00000098;
  size_t in_stack_000000a0;
  void *in_stack_000000a8;
  ZSTD_DCtx *in_stack_000000b0;
  ZSTD_longOffset_e in_stack_00001130;
  int in_stack_00001138;
  undefined8 local_8;
  
  iVar1 = ZSTD_DCtx_get_bmi2(in_RDI);
  if (iVar1 == 0) {
    local_8 = ZSTD_decompressSequencesLong_default
                        (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
                         in_stack_00000090,in_stack_0000008c,in_stack_00001130,in_stack_00001138);
  }
  else {
    local_8 = ZSTD_decompressSequencesLong_bmi2
                        (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
                         in_stack_00000090,in_stack_0000008c,in_stack_00001130,in_stack_00001138);
  }
  return local_8;
}

Assistant:

static size_t
ZSTD_decompressSequencesLong(ZSTD_DCtx* dctx,
                             void* dst, size_t maxDstSize,
                             const void* seqStart, size_t seqSize, int nbSeq,
                             const ZSTD_longOffset_e isLongOffset,
                             const int frame)
{
    DEBUGLOG(5, "ZSTD_decompressSequencesLong");
#if DYNAMIC_BMI2
    if (ZSTD_DCtx_get_bmi2(dctx)) {
        return ZSTD_decompressSequencesLong_bmi2(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
    }
#endif
  return ZSTD_decompressSequencesLong_default(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
}